

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

void initializer2(C_Parser *parser,C_Token **rest,C_Token *tok,Initializer *init)

{
  char cVar1;
  ushort uVar2;
  TypeKind TVar3;
  uint uVar4;
  uint uVar5;
  Initializer **ppIVar6;
  undefined7 uVar7;
  _Bool _Var8;
  int iVar9;
  C_Type *pCVar10;
  Initializer *pIVar11;
  ulong uVar12;
  C_Node *pCVar13;
  C_Member *pCVar14;
  C_Token *pCVar15;
  bool bVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  C_Token **rest_00;
  int end;
  int begin;
  C_Token *local_60;
  char *local_58;
  C_Token *local_50;
  C_Token **local_48;
  int local_40;
  int local_3c;
  C_Token *local_38;
  
  TVar3 = init->ty->kind;
  local_50 = tok;
  if (TVar3 == TY_UNION) {
    local_60 = tok;
    _Var8 = C_equal(tok,"{");
    if ((!_Var8) || (_Var8 = C_equal(local_60->next,"."), !_Var8)) {
      init->mem = init->ty->members;
      _Var8 = C_equal(local_60,"{");
      if (!_Var8) {
        initializer2(parser,rest,local_60,*init->children);
        return;
      }
      initializer2(parser,&local_60,local_60->next,*init->children);
      C_consume(&local_60,local_60,",");
      pCVar15 = local_60;
      goto LAB_0012ba44;
    }
    rest_00 = &local_60;
    pCVar14 = struct_designator(parser,rest_00,local_60->next,init->ty);
    init->mem = pCVar14;
    designation(parser,rest_00,local_60,init->children[pCVar14->idx]);
  }
  else {
    if (TVar3 == TY_STRUCT) {
      _Var8 = C_equal(tok,"{");
      if (!_Var8) {
        pCVar13 = assign(parser,rest,local_50);
        C_add_type(parser,pCVar13);
        if (pCVar13->ty->kind == TY_STRUCT) {
          init->expr = pCVar13;
          return;
        }
        struct_initializer2(parser,rest,local_50,init,init->ty->members);
        return;
      }
      local_60 = local_50;
      local_60 = C_skip(parser,local_50,"{");
      pCVar14 = init->ty->members;
      _Var8 = consume_end(rest,local_60);
      if (_Var8) {
        return;
      }
      bVar16 = true;
      do {
        if (!bVar16) {
          local_60 = C_skip(parser,local_60,",");
        }
        _Var8 = C_equal(local_60,".");
        if (_Var8) {
          pCVar14 = struct_designator(parser,&local_60,local_60,init->ty);
          designation(parser,&local_60,local_60,init->children[pCVar14->idx]);
LAB_0012b90b:
          pCVar14 = pCVar14->next;
        }
        else {
          if (pCVar14 != (C_Member *)0x0) {
            initializer2(parser,&local_60,local_60,init->children[pCVar14->idx]);
            goto LAB_0012b90b;
          }
          local_60 = skip_excess_element(parser,local_60);
          pCVar14 = (C_Member *)0x0;
        }
        _Var8 = consume_end(rest,local_60);
        bVar16 = false;
        if (_Var8) {
          return;
        }
      } while( true );
    }
    if (TVar3 == TY_ARRAY) {
      local_48 = rest;
      if (tok->kind == TK_STR) {
        if (init->is_flexible == true) {
          pCVar10 = C_array_of(parser,init->ty->base,tok->ty->array_len);
          pIVar11 = new_initializer(parser,pCVar10,false);
          pCVar10 = pIVar11->ty;
          pCVar15 = pIVar11->tok;
          _Var8 = pIVar11->is_flexible;
          uVar7 = *(undefined7 *)&pIVar11->field_0x19;
          pCVar13 = pIVar11->expr;
          ppIVar6 = pIVar11->children;
          init->next = pIVar11->next;
          init->ty = pCVar10;
          init->tok = pCVar15;
          init->is_flexible = _Var8;
          *(undefined7 *)&init->field_0x19 = uVar7;
          init->expr = pCVar13;
          init->children = ppIVar6;
          init->mem = pIVar11->mem;
        }
        uVar4 = init->ty->array_len;
        uVar5 = tok->ty->array_len;
        if ((int)uVar4 < (int)uVar5) {
          uVar5 = uVar4;
        }
        uVar12 = (ulong)uVar5;
        iVar9 = init->ty->base->size;
        if (iVar9 == 4) {
          if (0 < (int)uVar5) {
            local_58 = tok->str;
            uVar18 = 0;
            do {
              uVar4 = *(uint *)(local_58 + uVar18 * 4);
              pCVar13 = (C_Node *)
                        (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120)
              ;
              pCVar13->kind = ND_NUM;
              pCVar13->tok = tok;
              pCVar13->val = (ulong)uVar4;
              init->children[uVar18]->expr = pCVar13;
              uVar18 = uVar18 + 1;
            } while (uVar12 != uVar18);
          }
        }
        else if (iVar9 == 2) {
          if (0 < (int)uVar5) {
            local_58 = tok->str;
            uVar18 = 0;
            do {
              uVar2 = *(ushort *)(local_58 + uVar18 * 2);
              pCVar13 = (C_Node *)
                        (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120)
              ;
              pCVar13->kind = ND_NUM;
              pCVar13->tok = tok;
              pCVar13->val = (ulong)uVar2;
              init->children[uVar18]->expr = pCVar13;
              uVar18 = uVar18 + 1;
            } while (uVar12 != uVar18);
          }
        }
        else {
          if (iVar9 != 1) {
            C_error(parser,"internal error at %s:%d",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/chibicc/chibicc_parse.c"
                    ,0x3b4);
          }
          if (0 < (int)uVar5) {
            local_58 = tok->str;
            uVar18 = 0;
            do {
              cVar1 = local_58[uVar18];
              pCVar13 = (C_Node *)
                        (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120)
              ;
              pCVar13->kind = ND_NUM;
              pCVar13->tok = tok;
              pCVar13->val = (long)cVar1;
              init->children[uVar18]->expr = pCVar13;
              uVar18 = uVar18 + 1;
            } while (uVar12 != uVar18);
          }
        }
        *local_48 = tok->next;
        return;
      }
      _Var8 = C_equal(tok,"{");
      if (_Var8) {
        local_60 = local_50;
        local_60 = C_skip(parser,local_50,"{");
        if (init->is_flexible == true) {
          iVar9 = count_array_init_elements(parser,local_60,init->ty);
          pCVar10 = C_array_of(parser,init->ty->base,iVar9);
          pIVar11 = new_initializer(parser,pCVar10,false);
          pCVar10 = pIVar11->ty;
          pCVar15 = pIVar11->tok;
          _Var8 = pIVar11->is_flexible;
          uVar7 = *(undefined7 *)&pIVar11->field_0x19;
          pCVar13 = pIVar11->expr;
          ppIVar6 = pIVar11->children;
          init->next = pIVar11->next;
          init->ty = pCVar10;
          init->tok = pCVar15;
          init->is_flexible = _Var8;
          *(undefined7 *)&init->field_0x19 = uVar7;
          init->expr = pCVar13;
          init->children = ppIVar6;
          init->mem = pIVar11->mem;
        }
        if (init->is_flexible == true) {
          iVar9 = count_array_init_elements(parser,local_60,init->ty);
          pCVar10 = C_array_of(parser,init->ty->base,iVar9);
          pIVar11 = new_initializer(parser,pCVar10,false);
          pCVar10 = pIVar11->ty;
          pCVar15 = pIVar11->tok;
          _Var8 = pIVar11->is_flexible;
          uVar7 = *(undefined7 *)&pIVar11->field_0x19;
          pCVar13 = pIVar11->expr;
          ppIVar6 = pIVar11->children;
          init->next = pIVar11->next;
          init->ty = pCVar10;
          init->tok = pCVar15;
          init->is_flexible = _Var8;
          *(undefined7 *)&init->field_0x19 = uVar7;
          init->expr = pCVar13;
          init->children = ppIVar6;
          init->mem = pIVar11->mem;
        }
        _Var8 = consume_end(rest,local_60);
        if (_Var8) {
          return;
        }
        bVar16 = true;
        iVar9 = 0;
        do {
          if (!bVar16) {
            local_60 = C_skip(parser,local_60,",");
          }
          _Var8 = C_equal(local_60,"[");
          if (_Var8) {
            array_designator(parser,&local_60,local_60,init->ty,&local_3c,&local_40);
            iVar9 = local_40;
            lVar19 = (long)local_3c;
            if (local_3c <= local_40) {
              iVar17 = (local_40 - local_3c) + 1;
              do {
                designation(parser,&local_38,local_60,init->children[lVar19]);
                lVar19 = lVar19 + 1;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
            local_60 = local_38;
            rest = local_48;
          }
          else if (iVar9 < init->ty->array_len) {
            initializer2(parser,&local_60,local_60,init->children[iVar9]);
          }
          else {
            local_60 = skip_excess_element(parser,local_60);
          }
          iVar9 = iVar9 + 1;
          _Var8 = consume_end(rest,local_60);
          bVar16 = false;
        } while (!_Var8);
        return;
      }
      array_initializer2(parser,rest,local_50,init,0);
      return;
    }
    _Var8 = C_equal(tok,"{");
    if (!_Var8) {
      pCVar13 = assign(parser,rest,local_50);
      init->expr = pCVar13;
      return;
    }
    rest_00 = &local_50;
    initializer2(parser,rest_00,local_50->next,init);
  }
  pCVar15 = *rest_00;
LAB_0012ba44:
  pCVar15 = C_skip(parser,pCVar15,"}");
  *rest = pCVar15;
  return;
}

Assistant:

static void initializer2(C_Parser *parser, C_Token **rest, C_Token *tok, Initializer *init) {
  if (init->ty->kind == TY_ARRAY && tok->kind == TK_STR) {
    string_initializer(parser, rest, tok, init);
    return;
  }

  if (init->ty->kind == TY_ARRAY) {
    if (C_equal(tok, "{"))
      array_initializer1(parser, rest, tok, init);
    else
      array_initializer2(parser, rest, tok, init, 0);
    return;
  }

  if (init->ty->kind == TY_STRUCT) {
    if (C_equal(tok, "{")) {
      struct_initializer1(parser, rest, tok, init);
      return;
    }

    // A struct can be initialized with another struct. E.g.
    // `struct T x = y;` where y is a variable of type `struct T`.
    // Handle that case first.
    C_Node *expr = assign(parser, rest, tok);
    C_add_type(parser, expr);
    if (expr->ty->kind == TY_STRUCT) {
      init->expr = expr;
      return;
    }

    struct_initializer2(parser, rest, tok, init, init->ty->members);
    return;
  }

  if (init->ty->kind == TY_UNION) {
    union_initializer(parser, rest, tok, init);
    return;
  }

  if (C_equal(tok, "{")) {
    // An initializer for a scalar variable can be surrounded by
    // braces. E.g. `int x = {3};`. Handle that case.
    initializer2(parser, &tok, tok->next, init);
    *rest = C_skip(parser, tok, "}");
    return;
  }

  init->expr = assign(parser, rest, tok);
}